

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O2

Hop_Man_t * Abc_NtkPartStartHop(Abc_Ntk_t *pNtk)

{
  int iVar1;
  Hop_Man_t *p;
  Vec_Ptr_t *p_00;
  Abc_Obj_t *pAVar2;
  Abc_Obj_t *pAVar3;
  Hop_Obj_t *pHVar4;
  int iVar5;
  
  p = Hop_ManStart();
  p_00 = Vec_PtrAlloc(pNtk->vObjs->nSize + 1);
  p->vObjs = p_00;
  Vec_PtrPush(p_00,p->pConst1);
  pAVar3 = (Abc_Obj_t *)p->pConst1;
  pAVar2 = Abc_AigConst1(pNtk);
  pAVar2->pNext = pAVar3;
  for (iVar5 = 0; iVar5 < pNtk->vCis->nSize; iVar5 = iVar5 + 1) {
    pAVar3 = Abc_NtkCi(pNtk,iVar5);
    pAVar2 = (Abc_Obj_t *)Hop_ObjCreatePi(p);
    pAVar3->pNext = pAVar2;
  }
  iVar5 = 0;
  do {
    iVar1 = pNtk->vObjs->nSize;
    if (iVar1 <= iVar5) {
      for (iVar5 = 0; iVar5 < iVar1; iVar5 = iVar5 + 1) {
        pAVar3 = Abc_NtkObj(pNtk,iVar5);
        if (pAVar3 != (Abc_Obj_t *)0x0) {
          iVar1 = Abc_AigNodeIsAnd(pAVar3);
          if ((iVar1 != 0) && ((pAVar3->field_6).pCopy != (Abc_Obj_t *)0x0)) {
            pAVar3->pNext->pNtk = (Abc_Ntk_t *)((pAVar3->field_6).pCopy)->pNext;
          }
        }
        iVar1 = pNtk->vObjs->nSize;
      }
      for (iVar5 = 0; iVar5 < pNtk->vCos->nSize; iVar5 = iVar5 + 1) {
        pAVar3 = Abc_NtkCo(pNtk,iVar5);
        pHVar4 = Hop_ObjChild0Next(pAVar3);
        Hop_ObjCreatePo(p,pHVar4);
      }
      iVar5 = Hop_ManCheck(p);
      if (iVar5 == 0) {
        puts("Abc_NtkPartStartHop: HOP manager check has failed.");
      }
      return p;
    }
    pAVar3 = Abc_NtkObj(pNtk,iVar5);
    if (pAVar3 != (Abc_Obj_t *)0x0) {
      iVar1 = Abc_AigNodeIsAnd(pAVar3);
      if (iVar1 != 0) {
        pHVar4 = Hop_ObjChild0Next(pAVar3);
        pAVar2 = (Abc_Obj_t *)
                 Hop_And(p,pHVar4,(Hop_Obj_t *)
                                  ((ulong)(*(uint *)&pAVar3->field_0x14 >> 0xb & 1) ^
                                  *(ulong *)((long)pAVar3->pNtk->vObjs->pArray
                                                   [(pAVar3->vFanins).pArray[1]] + 8)));
        pAVar3->pNext = pAVar2;
        if (((ulong)pAVar2 & 1) != 0) {
          __assert_fail("!Abc_ObjIsComplement(pObj->pNext)",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcPart.c"
                        ,0x3cc,"Hop_Man_t *Abc_NtkPartStartHop(Abc_Ntk_t *)");
        }
      }
    }
    iVar5 = iVar5 + 1;
  } while( true );
}

Assistant:

Hop_Man_t * Abc_NtkPartStartHop( Abc_Ntk_t * pNtk )
{
    Hop_Man_t * pMan;
    Abc_Obj_t * pObj;
    int i;
    // start the HOP package
    pMan = Hop_ManStart();
    pMan->vObjs = Vec_PtrAlloc( Abc_NtkObjNumMax(pNtk) + 1  );
    Vec_PtrPush( pMan->vObjs, Hop_ManConst1(pMan) );
    // map constant node and PIs
    Abc_AigConst1(pNtk)->pNext = (Abc_Obj_t *)Hop_ManConst1(pMan);
    Abc_NtkForEachCi( pNtk, pObj, i )
        pObj->pNext = (Abc_Obj_t *)Hop_ObjCreatePi(pMan);
    // map the internal nodes
    Abc_AigForEachAnd( pNtk, pObj, i )
    {
        pObj->pNext = (Abc_Obj_t *)Hop_And( pMan, Hop_ObjChild0Next(pObj), Hop_ObjChild1Next(pObj) );
        assert( !Abc_ObjIsComplement(pObj->pNext) );
    }
    // set the choice nodes
    Abc_AigForEachAnd( pNtk, pObj, i )
    {
        if ( pObj->pCopy )
            ((Hop_Obj_t *)pObj->pNext)->pData = pObj->pCopy->pNext;
    }
    // transfer the POs
    Abc_NtkForEachCo( pNtk, pObj, i )
        Hop_ObjCreatePo( pMan, Hop_ObjChild0Next(pObj) );
    // check the new manager
    if ( !Hop_ManCheck(pMan) )
        printf( "Abc_NtkPartStartHop: HOP manager check has failed.\n" );
    return pMan;
}